

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_filter.hpp
# Opt level: O1

void __thiscall
duckdb::StructFilter::StructFilter
          (StructFilter *this,idx_t child_idx_p,string *child_name_p,
          unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
          *child_filter_p)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  (this->super_TableFilter).filter_type = STRUCT_EXTRACT;
  (this->super_TableFilter)._vptr_TableFilter = (_func_int **)&PTR__StructFilter_0248f318;
  this->child_idx = child_idx_p;
  paVar1 = &(this->child_name).field_2;
  (this->child_name)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (child_name_p->_M_dataplus)._M_p;
  paVar2 = &child_name_p->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&child_name_p->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->child_name).field_2 + 8) = uVar4;
  }
  else {
    (this->child_name)._M_dataplus._M_p = pcVar3;
    (this->child_name).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->child_name)._M_string_length = child_name_p->_M_string_length;
  (child_name_p->_M_dataplus)._M_p = (pointer)paVar2;
  child_name_p->_M_string_length = 0;
  (child_name_p->field_2)._M_local_buf[0] = '\0';
  (this->child_filter).
  super_unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>._M_t.
  super___uniq_ptr_impl<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_>.
  super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl =
       (child_filter_p->
       super_unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>)._M_t.
       super___uniq_ptr_impl<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_>.
       super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl;
  (child_filter_p->super_unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>)
  ._M_t.super___uniq_ptr_impl<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_>.
  super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl = (TableFilter *)0x0;
  return;
}

Assistant:

explicit TableFilter(TableFilterType filter_type_p) : filter_type(filter_type_p) {
	}